

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

int mqtt_client_connect(MQTT_CLIENT_HANDLE handle,XIO_HANDLE xioHandle,
                       MQTT_CLIENT_OPTIONS *mqttOptions)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ushort local_54;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  MQTT_CLIENT *mqtt_client;
  LOGGER_LOG l;
  int result;
  MQTT_CLIENT_OPTIONS *mqttOptions_local;
  XIO_HANDLE xioHandle_local;
  MQTT_CLIENT_HANDLE handle_local;
  
  if (((handle == (MQTT_CLIENT_HANDLE)0x0) || (mqttOptions == (MQTT_CLIENT_OPTIONS *)0x0)) ||
     (xioHandle == (XIO_HANDLE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"mqtt_client_connect",0x44f,1,
                "mqtt_client_connect: NULL argument (handle = %p, mqttOptions = %p, xioHandle: %p)",
                handle,mqttOptions,xioHandle);
    }
    l._4_4_ = 0x450;
  }
  else {
    handle->xioHandle = xioHandle;
    handle->packetState = UNKNOWN_TYPE;
    handle->qosValue = mqttOptions->qualityOfServiceValue;
    handle->keepAliveInterval = mqttOptions->keepAliveInterval;
    if (mqttOptions->keepAliveInterval / 2 < 0x51) {
      local_54 = mqttOptions->keepAliveInterval / 2;
    }
    else {
      local_54 = 0x50;
    }
    handle->maxPingRespTime = local_54;
    handle->timeSincePing = 0;
    iVar1 = cloneMqttOptions(handle,mqttOptions);
    if (iVar1 == 0) {
      iVar1 = xio_open(xioHandle,onOpenComplete,handle,onBytesReceived,handle,onIoError,handle);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                    ,"mqtt_client_connect",0x464,1,"Error: io_open failed");
        }
        l._4_4_ = 0x465;
        handle->xioHandle = (XIO_HANDLE)0x0;
        clear_mqtt_options(handle);
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"mqtt_client_connect",0x45d,1,"Error: Clone Mqtt Options failed");
      }
      l._4_4_ = 0x45e;
    }
  }
  return l._4_4_;
}

Assistant:

int mqtt_client_connect(MQTT_CLIENT_HANDLE handle, XIO_HANDLE xioHandle, MQTT_CLIENT_OPTIONS* mqttOptions)
{
    int result;
    /*SRS_MQTT_CLIENT_07_006: [If any of the parameters handle, ioHandle, or mqttOptions are NULL then mqtt_client_connect shall return a non-zero value.]*/
    if (handle == NULL || mqttOptions == NULL || xioHandle == NULL)
    {
        LogError("mqtt_client_connect: NULL argument (handle = %p, mqttOptions = %p, xioHandle: %p)", handle, mqttOptions, xioHandle);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
        mqtt_client->xioHandle = xioHandle;
        mqtt_client->packetState = UNKNOWN_TYPE;
        mqtt_client->qosValue = mqttOptions->qualityOfServiceValue;
        mqtt_client->keepAliveInterval = mqttOptions->keepAliveInterval;
        mqtt_client->maxPingRespTime = (DEFAULT_MAX_PING_RESPONSE_TIME < mqttOptions->keepAliveInterval/2) ? DEFAULT_MAX_PING_RESPONSE_TIME : mqttOptions->keepAliveInterval/2;
        mqtt_client->timeSincePing = 0;
        if (cloneMqttOptions(mqtt_client, mqttOptions) != 0)
        {
            LogError("Error: Clone Mqtt Options failed");
            result = MU_FAILURE;
        }
        /*Codes_SRS_MQTT_CLIENT_07_008: [mqtt_client_connect shall open the XIO_HANDLE by calling into the xio_open interface.]*/
        else if (xio_open(xioHandle, onOpenComplete, mqtt_client, onBytesReceived, mqtt_client, onIoError, mqtt_client) != 0)
        {
            /*Codes_SRS_MQTT_CLIENT_07_007: [If any failure is encountered then mqtt_client_connect shall return a non-zero value.]*/
            LogError("Error: io_open failed");
            result = MU_FAILURE;
            mqtt_client->xioHandle = NULL;
            // Remove cloned options
            clear_mqtt_options(mqtt_client);
        }
        else
        {
            result = 0;
        }
    }
    return result;
}